

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellId id)

{
  iterator iVar1;
  pointer pSVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer __args;
  S2CellId local_48;
  S2LogMessage local_40;
  
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.id_ = id.id_;
  bVar3 = Contains(this,id);
  if (bVar3) {
    iVar1._M_current =
         (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                ((vector<S2CellId,std::allocator<S2CellId>> *)&__return_storage_ptr__->cell_ids_,
                 iVar1,&local_48);
    }
    else {
      (iVar1._M_current)->id_ = id.id_;
      (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  else {
    __args = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = ~id.id_ & id.id_ - 1;
    uVar4 = (long)(this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__args >> 3;
    if (0 < (long)uVar4) {
      do {
        uVar5 = uVar4 >> 1;
        uVar4 = ~uVar5 + uVar4;
        pSVar2 = __args + uVar5 + 1;
        if (id.id_ - uVar6 <= __args[uVar5].id_) {
          uVar4 = uVar5;
          pSVar2 = __args;
        }
        __args = pSVar2;
      } while (0 < (long)uVar4);
    }
    if (__args != (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        if (uVar6 + id.id_ < __args->id_) break;
        iVar1._M_current =
             (__return_storage_ptr__->cell_ids_).
             super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->cell_ids_).
            super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                    ((vector<S2CellId,std::allocator<S2CellId>> *)&__return_storage_ptr__->cell_ids_
                     ,iVar1,__args);
        }
        else {
          (iVar1._M_current)->id_ = __args->id_;
          (__return_storage_ptr__->cell_ids_).
          super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        __args = __args + 1;
      } while (__args != (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  bVar3 = IsNormalized(__return_storage_ptr__);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    bVar3 = IsNormalized(this);
  }
  if (bVar3 != false) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: result.IsNormalized() || !IsNormalized() ",0x37);
    if (bVar3 != false) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Intersection(S2CellId id) const {
  S2CellUnion result;
  if (Contains(id)) {
    result.cell_ids_.push_back(id);
  } else {
    vector<S2CellId>::const_iterator i = std::lower_bound(
        cell_ids_.begin(), cell_ids_.end(), id.range_min());
    S2CellId id_max = id.range_max();
    while (i != cell_ids_.end() && *i <= id_max)
      result.cell_ids_.push_back(*i++);
  }
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}